

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationLimitsTests.cpp
# Opt level: O0

TestStatus *
vkt::tessellation::anon_unknown_1::deviceLimitsTestCase
          (TestStatus *__return_storage_ptr__,Context *context,LimitsCaseDefinition caseDef)

{
  InstanceInterface *vk;
  NotSupportedError *this;
  TestContext *this_00;
  allocator<char> local_4a9;
  string local_4a8;
  TestLog *local_488;
  TestLog *log;
  VkPhysicalDeviceProperties properties;
  allocator<char> local_131;
  string local_130;
  undefined1 local_10c [8];
  VkPhysicalDeviceFeatures features;
  VkPhysicalDevice physDevice;
  InstanceInterface *vki;
  Context *context_local;
  LimitsCaseDefinition caseDef_local;
  
  vk = Context::getInstanceInterface(context);
  features._212_8_ = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)local_10c,vk,(VkPhysicalDevice)features._212_8_);
  if (features.independentBlend != 0) {
    ::vk::getPhysicalDeviceProperties
              ((VkPhysicalDeviceProperties *)&log,vk,(VkPhysicalDevice)features._212_8_);
    this_00 = Context::getTestContext(context);
    local_488 = tcu::TestContext::getLog(this_00);
    context_local._4_4_ = caseDef.minimum;
    switch((ulong)caseDef & 0xffffffff) {
    case 0:
      expectGreaterOrEqual
                (__return_storage_ptr__,local_488,context_local._4_4_,
                 properties.limits.maxVertexInputBindingStride);
      break;
    case 1:
      expectGreaterOrEqual
                (__return_storage_ptr__,local_488,context_local._4_4_,
                 properties.limits.maxVertexOutputComponents);
      break;
    case 2:
      expectGreaterOrEqual
                (__return_storage_ptr__,local_488,context_local._4_4_,
                 properties.limits.maxTessellationGenerationLevel);
      break;
    case 3:
      expectGreaterOrEqual
                (__return_storage_ptr__,local_488,context_local._4_4_,
                 properties.limits.maxTessellationPatchSize);
      break;
    case 4:
      expectGreaterOrEqual
                (__return_storage_ptr__,local_488,context_local._4_4_,
                 properties.limits.maxTessellationControlPerVertexInputComponents);
      break;
    case 5:
      expectGreaterOrEqual
                (__return_storage_ptr__,local_488,context_local._4_4_,
                 properties.limits.maxTessellationControlPerVertexOutputComponents);
      break;
    case 6:
      expectGreaterOrEqual
                (__return_storage_ptr__,local_488,context_local._4_4_,
                 properties.limits.maxTessellationControlPerPatchOutputComponents);
      break;
    case 7:
      expectGreaterOrEqual
                (__return_storage_ptr__,local_488,context_local._4_4_,
                 properties.limits.maxTessellationControlTotalOutputComponents);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"Test error",&local_4a9);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator(&local_4a9);
    }
    return __return_storage_ptr__;
  }
  properties.sparseProperties.residencyNonResidentStrict._3_1_ = 1;
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Tessellation shader not supported",&local_131);
  tcu::NotSupportedError::NotSupportedError(this,&local_130);
  properties.sparseProperties.residencyNonResidentStrict._3_1_ = 0;
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestStatus deviceLimitsTestCase(Context& context, const LimitsCaseDefinition caseDef)
{
	const InstanceInterface&		vki			= context.getInstanceInterface();
	const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures	features	= getPhysicalDeviceFeatures(vki, physDevice);

	if (!features.tessellationShader)
		throw tcu::NotSupportedError("Tessellation shader not supported");

	const VkPhysicalDeviceProperties properties = getPhysicalDeviceProperties(vki, physDevice);
	tcu::TestLog&					 log		= context.getTestContext().getLog();

	switch (caseDef.limitType)
	{
		case LIMIT_MAX_TESSELLATION_GENERATION_LEVEL:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationGenerationLevel);
		case LIMIT_MAX_TESSELLATION_PATCH_SIZE:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationPatchSize);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_VERTEX_INPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerVertexInputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_VERTEX_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerVertexOutputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_PATCH_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerPatchOutputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_TOTAL_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlTotalOutputComponents);
		case LIMIT_MAX_TESSELLATION_EVALUATION_INPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationEvaluationInputComponents);
		case LIMIT_MAX_TESSELLATION_EVALUATION_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationEvaluationOutputComponents);
	}

	// Control should never get here.
	DE_FATAL("Internal test error");
	return tcu::TestStatus::fail("Test error");
}